

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void Func::Codegen(JitArenaAllocator *alloc,JITTimeWorkItem *workItem,
                  ThreadContextInfo *threadContextInfo,ScriptContextInfo *scriptContextInfo,
                  JITOutputIDL *outputData,EntryPointInfo *epInfo,
                  FunctionJITRuntimeInfo *runtimeInfo,
                  JITTimePolymorphicInlineCacheInfo *polymorphicInlineCacheInfo,
                  void *codeGenAllocators,ScriptContextProfiler *codeGenProfiler,
                  bool isBackgroundJIT)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 debugStringBuffer [42];
  RejitException ex;
  undefined1 local_478 [8];
  Func func;
  int rejitCounter;
  bool rejit;
  bool isBackgroundJIT_local;
  EntryPointInfo *epInfo_local;
  JITOutputIDL *outputData_local;
  ScriptContextInfo *scriptContextInfo_local;
  ThreadContextInfo *threadContextInfo_local;
  JITTimeWorkItem *workItem_local;
  JitArenaAllocator *alloc_local;
  
  func.m_lazyBailOutRecordSlot._7_1_ = isBackgroundJIT;
  func.m_lazyBailOutRecordSlot._0_4_ = 0;
  do {
    if (0x18 < (int)func.m_lazyBailOutRecordSlot) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x13b,"(rejitCounter < 25)","rejitCounter < 25");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Func((Func *)local_478,alloc,workItem,threadContextInfo,scriptContextInfo,outputData,epInfo,
         runtimeInfo,polymorphicInlineCacheInfo,codeGenAllocators,codeGenProfiler,
         (bool)(func.m_lazyBailOutRecordSlot._7_1_ & 1),(Func *)0x0,0xffffffff,0xffffffff,false,
         0xffff,false);
    TryCodegen((Func *)local_478);
    func.m_lazyBailOutRecordSlot._6_1_ = 0;
    ~Func((Func *)local_478);
  } while ((func.m_lazyBailOutRecordSlot._6_1_ & 1) != 0);
  return;
}

Assistant:

void
Func::Codegen(JitArenaAllocator *alloc, JITTimeWorkItem * workItem,
    ThreadContextInfo * threadContextInfo,
    ScriptContextInfo * scriptContextInfo,
    JITOutputIDL * outputData,
    Js::EntryPointInfo* epInfo, // for in-proc jit only
    const FunctionJITRuntimeInfo *const runtimeInfo,
    JITTimePolymorphicInlineCacheInfo * const polymorphicInlineCacheInfo, void * const codeGenAllocators,
#if !FLOATVAR
    CodeGenNumberAllocator * numberAllocator,
#endif
    Js::ScriptContextProfiler *const codeGenProfiler, const bool isBackgroundJIT)
{
    bool rejit;
    int rejitCounter = 0;
    do
    {
        Assert(rejitCounter < 25);
        Func func(alloc, workItem, threadContextInfo,
            scriptContextInfo, outputData, epInfo, runtimeInfo,
            polymorphicInlineCacheInfo, codeGenAllocators, 
#if !FLOATVAR
            numberAllocator,
#endif
            codeGenProfiler, isBackgroundJIT);
        try
        {
            func.TryCodegen();
            rejit = false;
        }
        catch (Js::RejitException ex)
        {
            // The work item needs to be rejitted, likely due to some optimization that was too aggressive
            switch (ex.Reason())
            {
            case RejitReason::AggressiveIntTypeSpecDisabled:
                outputData->disableAggressiveIntTypeSpec = TRUE;
                break;
            case RejitReason::InlineApplyDisabled:
                workItem->GetJITFunctionBody()->DisableInlineApply();
                outputData->disableInlineApply = TRUE;
                break;
            case RejitReason::InlineSpreadDisabled:
                workItem->GetJITFunctionBody()->DisableInlineSpread();
                outputData->disableInlineSpread = TRUE;
                break;
            case RejitReason::DisableStackArgOpt:
                outputData->disableStackArgOpt = TRUE;
                break;
            case RejitReason::DisableStackArgLenAndConstOpt:
                break;
            case RejitReason::DisableSwitchOptExpectingInteger:
            case RejitReason::DisableSwitchOptExpectingString:
                outputData->disableSwitchOpt = TRUE;
                break;
            case RejitReason::ArrayCheckHoistDisabled:
            case RejitReason::ArrayAccessHelperCallEliminationDisabled:
                outputData->disableArrayCheckHoist = TRUE;
                break;
            case RejitReason::TrackIntOverflowDisabled:
                outputData->disableTrackCompoundedIntOverflow = TRUE;
                break;
            case RejitReason::MemOpDisabled:
                outputData->disableMemOp = TRUE;
                break;
            case RejitReason::FailedEquivalentTypeCheck:
                // No disable flag. The thrower of the re-jit exception must guarantee that objtypespec is disabled where appropriate.
                break;
            default:
                Assume(UNREACHED);
            }

            if (PHASE_TRACE(Js::ReJITPhase, &func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(
                    _u("Rejit (compile-time): function: %s (%s) reason: %S\n"),
                    workItem->GetJITFunctionBody()->GetDisplayName(),
                    workItem->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer),
                    ex.ReasonName());
            }

            rejit = true;
            rejitCounter++;
        }
        // Either the entry point has a reference to the number now, or we failed to code gen and we
        // don't need to numbers, we can flush the completed page now.
        //
        // If the number allocator is NULL then we are shutting down the thread context and so too the
        // code generator. The number allocator must be freed before the recycler (and thus before the
        // code generator) so we can't and don't need to flush it.

        // TODO: OOP JIT, allocator cleanup
    } while (rejit);
}